

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_cdrop_row.c
# Opt level: O3

int ilu_cdrop_row(superlu_options_t *options,int first,int last,double drop_tol,int quota,int *nnzLj
                 ,double *fill_tol,GlobalLU_t *Glu,float *swork,float *swork2,int lastc)

{
  singlecomplex *psVar1;
  singlecomplex *cx;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  integer iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int_t *piVar11;
  double dVar12;
  void *pvVar13;
  ulong uVar14;
  int_t *piVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  float *pfVar19;
  int iVar20;
  long lVar21;
  float fVar22;
  double dVar23;
  float fVar25;
  undefined1 auVar24 [16];
  float fVar26;
  float fVar27;
  int len;
  singlecomplex one;
  int i_1;
  uint local_140;
  uint local_13c;
  ulong local_138;
  long local_130;
  double local_128;
  int_t *local_120;
  ulong local_118;
  int_t *local_110;
  int local_104;
  double local_100;
  singlecomplex local_f8;
  float *local_f0;
  uint local_e4;
  singlecomplex local_e0;
  norm_t local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  long local_c8;
  void *local_c0;
  int_t *local_b8;
  void *local_b0;
  int_t *local_a8;
  double local_a0;
  int local_94;
  int local_90;
  float local_8c;
  uint local_88;
  integer local_84;
  int *local_80;
  double *local_78;
  long local_70;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong local_58;
  long local_50;
  double local_48;
  long local_40;
  int_t *local_38;
  
  pvVar2 = Glu->lusup;
  local_120 = Glu->lsub;
  piVar11 = Glu->xlsub;
  piVar15 = Glu->xlusup;
  local_128 = (double)CONCAT44(local_128._4_4_,options->ILU_DropRule);
  local_d8 = options->ILU_Norm;
  local_118 = (ulong)options->ILU_MILU;
  local_e0.r = 1.0;
  local_e0.i = 0.0;
  local_84 = 1;
  local_a0 = drop_tol;
  local_90 = quota;
  local_78 = fill_tol;
  local_48 = pow((double)Glu->n,-1.0 / options->ILU_MILU_Dim);
  local_40 = (long)first;
  iVar20 = piVar15[local_40];
  local_130 = (long)iVar20;
  local_c8 = (long)piVar11[local_40];
  local_13c = piVar15[local_40 + 1] - iVar20;
  local_58 = (ulong)local_13c;
  uVar5 = last - first;
  local_140 = uVar5 + 1;
  if (lastc == 0) {
    local_e4 = 0;
  }
  else {
    local_e4 = piVar15[(long)last + 2] - piVar15[(long)last + 1];
  }
  if ((piVar15[local_40 + 1] == iVar20) || (local_128._0_4_ == 0 || local_13c == local_140)) {
    iVar20 = local_13c * local_140;
    local_138._0_4_ = 0;
    goto LAB_0010bde0;
  }
  uVar8 = (ulong)(local_13c - 1);
  local_50 = (long)(int)~uVar5;
  local_f0 = swork + local_50;
  local_70 = (long)pvVar2 + -8;
  local_110 = piVar11;
  local_104 = last;
  local_94 = first;
  local_80 = nnzLj;
  local_38 = piVar15;
  if ((int)uVar5 < (int)(local_13c - 1)) {
    pvVar13 = (void *)(ulong)(iVar20 - 1);
    piVar11 = (int_t *)(long)(int)uVar5;
    local_b8 = local_120 + local_c8;
    local_c0 = (void *)((long)pvVar2 + local_130 * 8);
    _local_68 = ZEXT812(0x3f800000);
    uStack_5c = 0;
    local_138 = 0;
    local_88 = (int)local_118 - 1;
    local_b0 = pvVar13;
LAB_0010bea2:
    local_a8 = (int_t *)((long)piVar11 + 1);
    psVar1 = (singlecomplex *)((long)pvVar2 + ((long)piVar11 + local_130 + 1) * 8);
    uVar8 = (ulong)(int)uVar8;
    uVar14 = local_138 & 0xffffffff;
    do {
      piVar11 = local_a8;
      if (local_d8 == TWO_NORM) {
        fVar22 = scnrm2_((integer *)&local_140,psVar1,(integer *)&local_13c);
        dVar23 = (double)(int)local_140;
        if (dVar23 < 0.0) {
          local_8c = fVar22;
          dVar23 = sqrt(dVar23);
          fVar22 = local_8c;
        }
        else {
          dVar23 = SQRT(dVar23);
        }
LAB_0010bf5e:
        dVar23 = (double)fVar22 / dVar23;
      }
      else {
        if (local_d8 == ONE_NORM) {
          fVar22 = scasum_((integer *)&local_140,psVar1,(integer *)&local_13c);
          dVar23 = (double)(int)local_140;
          goto LAB_0010bf5e;
        }
        iVar6 = icamax_((integer *)&local_140,psVar1,(integer *)&local_13c);
        dVar23 = c_abs1(psVar1 + (long)(int)local_13c * ((long)iVar6 + -1));
      }
      fVar22 = (float)dVar23;
      local_f0[(long)piVar11] = fVar22;
      uVar4 = local_138;
      if ((((ulong)local_128 & 1) == 0) || (uVar4 = uVar14, local_a0 <= (double)fVar22))
      goto LAB_0010c119;
      local_100 = (double)uVar8;
      if ((int)uVar14 < 1) {
        lVar9 = uVar8 + local_130;
        cx = (singlecomplex *)((long)pvVar2 + lVar9 * 8);
        cswap_((integer *)&local_140,cx,(integer *)&local_13c,psVar1,(integer *)&local_13c);
        if (((int)local_118 == 3) && (0 < (int)local_140)) {
          iVar20 = 0;
          do {
            dVar23 = c_abs1(cx + (int)(local_13c * iVar20));
            lVar16 = (int)(local_13c * iVar20) + lVar9;
            *(float *)((long)pvVar2 + lVar16 * 8) = (float)dVar23;
            *(undefined4 *)((long)pvVar2 + lVar16 * 8 + 4) = 0;
            iVar20 = iVar20 + 1;
          } while (iVar20 < (int)local_140);
        }
      }
      else {
        if (local_88 < 2) {
          caxpy_((integer *)&local_140,&local_e0,psVar1,(integer *)&local_13c,
                 (singlecomplex *)(local_70 + ((int)local_13c + local_130) * 8),
                 (integer *)&local_13c);
        }
        else if (((int)local_118 == 3) && (0 < (int)local_140)) {
          iVar20 = 0;
          do {
            dVar23 = c_abs1(psVar1 + (int)(local_13c * iVar20));
            lVar9 = (long)(int)(local_13c * iVar20 + (int)pvVar13 + local_13c);
            *(float *)((long)pvVar2 + lVar9 * 8) =
                 (float)((double)*(float *)((long)pvVar2 + lVar9 * 8) + dVar23);
            iVar20 = iVar20 + 1;
          } while (iVar20 < (int)local_140);
        }
        ccopy_((integer *)&local_140,(singlecomplex *)((long)local_c0 + uVar8 * 8),
               (integer *)&local_13c,psVar1,(integer *)&local_13c);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      local_b8[(long)local_a8] = local_b8[(long)local_100];
      uVar8 = (long)local_100 - 1;
      pvVar13 = local_b0;
      if ((long)local_100 <= (long)local_a8) {
        uVar8 = uVar8 & 0xffffffff;
        uVar5 = local_68._0_4_;
        fStack_d4 = (float)local_68._4_4_;
        uStack_d0 = uStack_60;
        uStack_cc = uStack_5c;
        local_138 = uVar14;
        goto LAB_0010c181;
      }
    } while( true );
  }
  uVar5 = 0x3f800000;
  fStack_d4 = 0.0;
  local_138 = 0;
  uStack_d0 = 0;
  uStack_cc = 0;
LAB_0010c181:
  uVar18 = local_140;
  local_d8 = uVar5;
  dVar23 = ceil((double)local_90 / (double)(int)local_140);
  if (((ulong)local_128 & 0xe) == 0) {
LAB_0010c24a:
    iVar20 = (int)local_118;
  }
  else {
    iVar20 = (int)dVar23;
    if ((int)(local_13c - (int)local_138) <= iVar20) goto LAB_0010c24a;
    local_100 = (double)uVar8;
    if ((int)uVar18 < iVar20) {
      auVar24._4_4_ = fStack_d4;
      auVar24._0_4_ = local_d8;
      auVar24._8_4_ = uStack_d0;
      auVar24._12_4_ = uStack_cc;
      if ((local_128._0_4_ >> 8 & 1) == 0) {
        local_f8.r = (float)(((int)uVar8 - uVar18) + 1);
        scopy_((integer *)&local_f8,swork,&local_84,swork2,&local_84);
        fVar22 = sqselect((int)local_f8.r,swork2,iVar20 - local_140);
        dVar23 = (double)fVar22;
        uVar18 = local_140;
      }
      else {
        auVar24 = divps(_DAT_0011d6a0,auVar24);
        dVar23 = 1.0 / (double)(((float)iVar20 * (auVar24._0_4_ - auVar24._4_4_)) /
                                (float)(int)(local_13c - ((int)local_138 + uVar18)) + auVar24._4_4_)
        ;
      }
    }
    else {
      dVar23 = (double)fStack_d4;
    }
    iVar20 = (int)local_118;
    if ((int)uVar18 <= SUB84(local_100,0)) {
      lVar9 = (long)SUB84(local_100,0);
      local_b0 = (void *)((long)pvVar2 + local_130 * 8);
      local_b8 = (int_t *)CONCAT44(local_b8._4_4_,iVar20 + -1);
      dVar12 = (double)(ulong)((int)local_130 - 1);
      piVar11 = local_120 + local_c8;
      do {
        iVar20 = (int)local_118;
        lVar16 = (long)(int)uVar18 + -1;
        iVar10 = (int)local_130 + uVar18;
        lVar21 = (long)(int)uVar18 << 0x20;
        while (dVar23 < (double)local_f0[lVar16 + 1]) {
          lVar16 = lVar16 + 1;
          iVar10 = iVar10 + 1;
          uVar18 = uVar18 + 1;
          lVar21 = lVar21 + 0x100000000;
          if (lVar9 <= lVar16) goto LAB_0010c259;
        }
        pvVar13 = (void *)(long)iVar10;
        local_d8 = (norm_t)lVar9;
        fStack_d4 = (float)((ulong)lVar9 >> 0x20);
        local_128 = dVar12;
        local_a8 = piVar11;
        local_a0 = dVar23;
        if ((int)local_138 < 1) {
          local_100 = (double)(local_130 + lVar9);
          psVar1 = (singlecomplex *)((long)pvVar2 + (long)local_100 * 8);
          cswap_((integer *)&local_140,psVar1,(integer *)&local_13c,
                 (singlecomplex *)((long)pvVar2 + (long)pvVar13 * 8),(integer *)&local_13c);
          if ((iVar20 == 3) && (0 < (int)local_140)) {
            iVar20 = 0;
            do {
              dVar23 = c_abs1(psVar1 + (int)(local_13c * iVar20));
              lVar9 = (long)(int)(local_13c * iVar20) + (long)local_100;
              *(float *)((long)pvVar2 + lVar9 * 8) = (float)dVar23;
              *(undefined4 *)((long)pvVar2 + lVar9 * 8 + 4) = 0;
              iVar20 = iVar20 + 1;
            } while (iVar20 < (int)local_140);
          }
        }
        else {
          local_c0 = pvVar13;
          if ((uint)local_b8 < 2) {
            caxpy_((integer *)&local_140,&local_e0,
                   (singlecomplex *)((long)pvVar2 + (long)pvVar13 * 8),(integer *)&local_13c,
                   (singlecomplex *)(local_70 + ((int)local_13c + local_130) * 8),
                   (integer *)&local_13c);
          }
          else if ((iVar20 == 3) && (0 < (int)local_140)) {
            iVar20 = 0;
            do {
              dVar23 = c_abs1((singlecomplex *)
                              ((long)pvVar2 + (long)(int)(local_13c * iVar20 + iVar10) * 8));
              lVar9 = (long)(int)(local_13c * iVar20 + SUB84(local_128,0) + local_13c);
              *(float *)((long)pvVar2 + lVar9 * 8) =
                   (float)((double)*(float *)((long)pvVar2 + lVar9 * 8) + dVar23);
              iVar20 = iVar20 + 1;
            } while (iVar20 < (int)local_140);
          }
          ccopy_((integer *)&local_140,
                 (singlecomplex *)((long)local_b0 + CONCAT44(fStack_d4,local_d8) * 8),
                 (integer *)&local_13c,(singlecomplex *)((long)pvVar2 + (long)local_c0 * 8),
                 (integer *)&local_13c);
        }
        local_138 = (ulong)((int)local_138 + 1);
        lVar3 = CONCAT44(fStack_d4,local_d8);
        local_120[(int)((int)local_c8 + uVar18)] = local_a8[lVar3];
        lVar9 = lVar3 + -1;
        local_f0[lVar16 + 1] = local_f0[lVar3 + -1];
        iVar20 = (int)local_118;
        dVar12 = local_128;
        piVar11 = local_a8;
        dVar23 = local_a0;
      } while (lVar21 >> 0x20 < lVar3);
    }
  }
LAB_0010c259:
  piVar15 = local_110;
  piVar11 = local_120;
  uVar18 = local_13c;
  uVar5 = local_140;
  if ((int)local_140 < (int)local_13c) {
    memset(swork + (int)local_140 + local_50,0,(ulong)(~local_140 + local_13c) * 4 + 4);
    iVar20 = (int)local_118;
  }
  if ((int)local_138 == 0) {
    iVar20 = uVar18 * uVar5;
    local_138._0_4_ = 0;
    nnzLj = local_80;
  }
  else {
    if ((iVar20 != 0) && (uVar18 = local_13c, 0 < (int)uVar5)) {
      iVar10 = (int)local_58;
      iVar20 = (int)local_130;
      local_100 = (1.0 - (double)(float)local_48) + (1.0 - (double)(float)local_48);
      pfVar19 = (float *)((long)pvVar2 + local_130 * 8);
      lVar9 = 0;
      local_f0 = (float *)((ulong)local_f0 & 0xffffffff00000000);
      do {
        local_f8 = *(singlecomplex *)
                    ((long)pvVar2 +
                    (long)(int)(local_13c + iVar20 + -1 + (int)lVar9 * local_13c) * 8);
        if (((ulong)local_f8 & 0x7fffffff7fffffff) != 0) {
          dVar23 = c_abs1(&local_f8);
          fVar22 = 1.0;
          if (local_100 / dVar23 < 1.0) {
            dVar23 = c_abs1(&local_f8);
            fVar22 = (float)(local_100 / dVar23);
          }
          fVar25 = local_f8.i;
          local_f8.r = fVar22 * local_f8.r;
          local_f8.i = fVar22 * fVar25;
          iVar7 = (int)local_118;
          if (iVar7 == 3) {
LAB_0010c3e9:
            fVar22 = local_f8.r + local_e0.r;
            fVar25 = local_f8.i + local_e0.i;
            fVar26 = (float)*(undefined8 *)pfVar19;
            fVar27 = (float)((ulong)*(undefined8 *)pfVar19 >> 0x20);
            *(ulong *)pfVar19 =
                 CONCAT44(fVar22 * fVar27 + fVar26 * fVar25,fVar22 * fVar26 + -fVar27 * fVar25);
          }
          else if (iVar7 == 2) {
            local_128 = (double)*pfVar19;
            dVar23 = c_abs1(&local_f8);
            *pfVar19 = (float)((dVar23 + 1.0) * local_128);
            local_128 = (double)pfVar19[1];
            dVar23 = c_abs1(&local_f8);
            pfVar19[1] = (float)((dVar23 + 1.0) * local_128);
          }
          else if (iVar7 == 1) {
            if ((((local_f8.r != -1.0) || (NAN(local_f8.r))) || (local_f8.i != 0.0)) ||
               (NAN(local_f8.i))) goto LAB_0010c3e9;
            *(ulong *)pfVar19 =
                 CONCAT44((float)(*local_78 * (double)(float)((ulong)*(undefined8 *)pfVar19 >> 0x20)
                                 ),(float)(*local_78 * (double)(float)*(undefined8 *)pfVar19));
            local_f0 = (float *)CONCAT44(local_f0._4_4_,(int)local_f0 + 1);
          }
        }
        lVar9 = lVar9 + 1;
        pfVar19 = pfVar19 + (long)(iVar10 + 1) * 2;
      } while (lVar9 < (int)local_140);
      piVar11 = local_120;
      piVar15 = local_110;
      uVar18 = local_13c;
      uVar5 = local_140;
      if (0 < (int)local_f0) {
        *local_78 = (double)-(int)local_f0;
      }
    }
    uVar17 = uVar18 - (int)local_138;
    if (1 < (int)uVar5) {
      lVar9 = local_130 * 8 + (long)(int)uVar18 * 8 + (long)pvVar2;
      lVar16 = (long)(int)uVar17 * 8 + local_130 * 8 + (long)pvVar2;
      uVar8 = 1;
      do {
        if (0 < (int)uVar17) {
          uVar14 = 0;
          do {
            *(undefined8 *)(lVar16 + uVar14 * 8) = *(undefined8 *)(lVar9 + uVar14 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + (long)(int)uVar18 * 8;
        lVar16 = lVar16 + (long)(int)uVar17 * 8;
      } while (uVar8 != uVar5);
    }
    if (0 < (int)local_e4) {
      uVar8 = 0;
      do {
        *(undefined8 *)((long)pvVar2 + uVar8 * 8 + (long)(int)(uVar5 * uVar17) * 8 + local_130 * 8)
             = *(undefined8 *)
                ((long)pvVar2 + uVar8 * 8 + (long)(int)(uVar18 * uVar5) * 8 + local_130 * 8);
        uVar8 = uVar8 + 1;
      } while (local_e4 != uVar8);
      if (0 < (int)local_e4) {
        lVar9 = 0;
        do {
          piVar11[(piVar15[(long)local_104 + 1] - (int)local_138) + (int)lVar9] =
               piVar11[lVar9 + piVar15[(long)local_104 + 1]];
          lVar9 = lVar9 + 1;
        } while (local_e4 != (uint)lVar9);
      }
    }
    if (local_94 <= local_104) {
      iVar20 = -(int)local_138;
      do {
        local_38[local_40 + 1] = local_38[local_40 + 1] + iVar20;
        piVar15[local_40 + 1] = piVar15[local_40 + 1] - (int)local_138;
        local_40 = local_40 + 1;
        iVar20 = iVar20 - (int)local_138;
      } while (local_40 <= local_104);
    }
    if (lastc != 0) {
      local_38[(long)local_104 + 2] = local_38[(long)local_104 + 2] - uVar5 * (int)local_138;
      piVar15[(long)local_104 + 2] = piVar15[(long)local_104 + 2] - (int)local_138;
    }
    iVar20 = uVar17 * uVar5;
    nnzLj = local_80;
  }
LAB_0010bde0:
  *nnzLj = *nnzLj + iVar20;
  return (int)local_138;
LAB_0010c119:
  local_138 = uVar4;
  uVar5 = ~-(uint)(fVar22 < (float)local_68._0_4_) & local_68._0_4_ |
          (uint)fVar22 & -(uint)(fVar22 < (float)local_68._0_4_);
  fStack_d4 = (float)(~-(uint)((float)local_68._4_4_ < fVar22) & local_68._4_4_ |
                     (uint)fVar22 & -(uint)((float)local_68._4_4_ < fVar22));
  local_68._4_4_ = fStack_d4;
  local_68._0_4_ = uVar5;
  uStack_d0 = uStack_60;
  uStack_cc = uStack_5c;
  if ((long)(int)uVar8 <= (long)piVar11) goto LAB_0010c181;
  goto LAB_0010bea2;
}

Assistant:

int ilu_cdrop_row(
	superlu_options_t *options, /* options */
	int    first,	    /* index of the first column in the supernode */
	int    last,	    /* index of the last column in the supernode */
	double drop_tol,    /* dropping parameter */
	int    quota,	    /* maximum nonzero entries allowed */
	int    *nnzLj,	    /* in/out number of nonzeros in L(:, 1:last) */
	double *fill_tol,   /* in/out - on exit, fill_tol=-num_zero_pivots,
			     * does not change if options->ILU_MILU != SMILU1 */
	GlobalLU_t *Glu,    /* modified */
	float swork[],   /* working space
	                     * the length of swork[] should be no less than
			     * the number of rows in the supernode */
	float swork2[], /* working space with the same size as swork[],
			     * used only by the second dropping rule */
	int    lastc	    /* if lastc == 0, there is nothing after the
			     * working supernode [first:last];
			     * if lastc == 1, there is one more column after
			     * the working supernode. */ )
{
    register int i, j, k, m1;
    register int nzlc; /* number of nonzeros in column last+1 */
    int_t xlusup_first, xlsub_first;
    int m, n; /* m x n is the size of the supernode */
    int r = 0; /* number of dropped rows */
    register float *temp;
    register singlecomplex *lusup = (singlecomplex *) Glu->lusup;
    int_t *lsub = Glu->lsub;
    int_t *xlsub = Glu->xlsub;
    int_t *xlusup = Glu->xlusup;
    register float d_max = 0.0, d_min = 1.0;
    int    drop_rule = options->ILU_DropRule;
    milu_t milu = options->ILU_MILU;
    norm_t nrm = options->ILU_Norm;
    singlecomplex one = {1.0, 0.0};
    singlecomplex none = {-1.0, 0.0};
    int i_1 = 1;
    int inc_diag; /* inc_diag = m + 1 */
    int nzp = 0;  /* number of zero pivots */
    float alpha = pow((double)(Glu->n), -1.0 / options->ILU_MILU_Dim);

    xlusup_first = xlusup[first];
    xlsub_first = xlsub[first];
    m = xlusup[first + 1] - xlusup_first;
    n = last - first + 1;
    m1 = m - 1;
    inc_diag = m + 1;
    nzlc = lastc ? (xlusup[last + 2] - xlusup[last + 1]) : 0;
    temp = swork - n;

    /* Quick return if nothing to do. */
    if (m == 0 || m == n || drop_rule == NODROP)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* basic dropping: ILU(tau) */
    for (i = n; i <= m1; )
    {
	/* the average abs value of ith row */
	switch (nrm)
	{
	    case ONE_NORM:
		temp[i] = scasum_(&n, &lusup[xlusup_first + i], &m) / (double)n;
		break;
	    case TWO_NORM:
		temp[i] = scnrm2_(&n, &lusup[xlusup_first + i], &m)
		    / sqrt((double)n);
		break;
	    case INF_NORM:
	    default:
		k = icamax_(&n, &lusup[xlusup_first + i], &m) - 1;
		temp[i] = c_abs1(&lusup[xlusup_first + i + m * k]);
		break;
	}

	/* drop small entries due to drop_tol */
	if (drop_rule & DROP_BASIC && temp[i] < drop_tol)
	{
	    r++;
	    /* drop the current row and move the last undropped row here */
	    if (r > 1) /* add to last row */
	    {
		/* accumulate the sum (for MILU) */
		switch (milu)
		{
		    case SMILU_1:
		    case SMILU_2:
			caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				&lusup[xlusup_first + m - 1], &m);
			break;
		    case SMILU_3:
			for (j = 0; j < n; j++)
			    lusup[xlusup_first + (m - 1) + j * m].r +=
				    c_abs1(&lusup[xlusup_first + i + j * m]);
			break;
		    case SILU:
		    default:
			break;
		}
		ccopy_(&n, &lusup[xlusup_first + m1], &m,
                       &lusup[xlusup_first + i], &m);
	    } /* if (r > 1) */
	    else /* move to last row */
	    {
		cswap_(&n, &lusup[xlusup_first + m1], &m,
			&lusup[xlusup_first + i], &m);
		if (milu == SMILU_3)
		    for (j = 0; j < n; j++) {
			lusup[xlusup_first + m1 + j * m].r =
				c_abs1(&lusup[xlusup_first + m1 + j * m]);
			lusup[xlusup_first + m1 + j * m].i = 0.0;
                    }
	    }
	    lsub[xlsub_first + i] = lsub[xlsub_first + m1];
	    m1--;
	    continue;
	} /* if dropping */
	else
	{
	    if (temp[i] > d_max) d_max = temp[i];
	    if (temp[i] < d_min) d_min = temp[i];
	}
	i++;
    } /* for */

    /* Secondary dropping: drop more rows according to the quota. */
    quota = ceil((double)quota / (double)n);
    if (drop_rule & DROP_SECONDARY && m - r > quota)
    {
	register double tol = d_max;

	/* Calculate the second dropping tolerance */
	if (quota > n)
	{
	    if (drop_rule & DROP_INTERP) /* by interpolation */
	    {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / (m - n - r));
	    }
	    else /* by quick select */
	    {
		int len = m1 - n + 1;
		scopy_(&len, swork, &i_1, swork2, &i_1);
		tol = sqselect(len, swork2, quota - n);
#if 0
		register int *itemp = iwork - n;
		A = temp;
		for (i = n; i <= m1; i++) itemp[i] = i;
		qsort(iwork, m1 - n + 1, sizeof(int), _compare_);
		tol = temp[itemp[quota]];
#endif
	    }
	}

	for (i = n; i <= m1; )
	{
	    if (temp[i] <= tol)
	    {
		register int j;
		r++;
		/* drop the current row and move the last undropped row here */
		if (r > 1) /* add to last row */
		{
		    /* accumulate the sum (for MILU) */
		    switch (milu)
		    {
			case SMILU_1:
			case SMILU_2:
			    caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				    &lusup[xlusup_first + m - 1], &m);
			    break;
			case SMILU_3:
			    for (j = 0; j < n; j++)
				lusup[xlusup_first + (m - 1) + j * m].r +=
   				  c_abs1(&lusup[xlusup_first + i + j * m]);
			    break;
			case SILU:
			default:
			    break;
		    }
		    ccopy_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		} /* if (r > 1) */
		else /* move to last row */
		{
		    cswap_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		    if (milu == SMILU_3)
			for (j = 0; j < n; j++) {
			    lusup[xlusup_first + m1 + j * m].r =
				    c_abs1(&lusup[xlusup_first + m1 + j * m]);
			    lusup[xlusup_first + m1 + j * m].i = 0.0;
                        }
		}
		lsub[xlsub_first + i] = lsub[xlsub_first + m1];
		m1--;
		temp[i] = temp[m1];

		continue;
	    }
	    i++;

	} /* for */

    } /* if secondary dropping */

    for (i = n; i < m; i++) temp[i] = 0.0;

    if (r == 0)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* add dropped entries to the diagonal */
    if (milu != SILU)
    {
	register int j;
	singlecomplex t;
	float omega;
	for (j = 0; j < n; j++)
	{
	    t = lusup[xlusup_first + (m - 1) + j * m];
            if (t.r == 0.0 && t.i == 0.0) continue;
            omega = SUPERLU_MIN(2.0 * (1.0 - alpha) / c_abs1(&t), 1.0);
	    cs_mult(&t, &t, omega);

 	    switch (milu)
	    {
		case SMILU_1:
		    if ( !(c_eq(&t, &none)) ) {
                        c_add(&t, &t, &one);
                        cc_mult(&lusup[xlusup_first + j * inc_diag],
			                  &lusup[xlusup_first + j * inc_diag],
                                          &t);
                    }
		    else
		    {
                        cs_mult(
                                &lusup[xlusup_first + j * inc_diag],
			        &lusup[xlusup_first + j * inc_diag],
                                *fill_tol);
#ifdef DEBUG
			printf("[1] ZERO PIVOT: FILL col %d.\n", first + j);
			fflush(stdout);
#endif
			nzp++;
		    }
		    break;
		case SMILU_2:
                    cs_mult(&lusup[xlusup_first + j * inc_diag],
                                          &lusup[xlusup_first + j * inc_diag],
                                          1.0 + c_abs1(&t));
		    break;
		case SMILU_3:
                    c_add(&t, &t, &one);
                    cc_mult(&lusup[xlusup_first + j * inc_diag],
	                              &lusup[xlusup_first + j * inc_diag],
                                      &t);
		    break;
		case SILU:
		default:
		    break;
	    }
	}
	if (nzp > 0) *fill_tol = -nzp;
    }

    /* Remove dropped entries from the memory and fix the pointers. */
    m1 = m - r;
    for (j = 1; j < n; j++)
    {
	register int tmp1, tmp2;
	tmp1 = xlusup_first + j * m1;
	tmp2 = xlusup_first + j * m;
	for (i = 0; i < m1; i++)
	    lusup[i + tmp1] = lusup[i + tmp2];
    }
    for (i = 0; i < nzlc; i++)
	lusup[xlusup_first + i + n * m1] = lusup[xlusup_first + i + n * m];
    for (i = 0; i < nzlc; i++)
	lsub[xlsub[last + 1] - r + i] = lsub[xlsub[last + 1] + i];
    for (i = first + 1; i <= last + 1; i++)
    {
	xlusup[i] -= r * (i - first);
	xlsub[i] -= r;
    }
    if (lastc)
    {
	xlusup[last + 2] -= r * n;
	xlsub[last + 2] -= r;
    }

    *nnzLj += (m - r) * n;
    return r;
}